

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int print_lambda(char *fn,float32 min,float32 max)

{
  float fVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint32 n_lmb;
  float32 *lmb;
  uint local_24;
  float32 local_20;
  float32 local_1c;
  float32 *local_18;
  
  local_20 = max;
  local_1c = min;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0x73,"Reading %s\n",fn);
  iVar2 = s3lamb_read(fn,&local_18,&local_24);
  iVar3 = -1;
  if ((iVar2 == 0) && (iVar3 = 0, local_24 != 0)) {
    uVar4 = 0;
    do {
      fVar1 = (float)local_18[uVar4];
      if (((float)local_1c <= fVar1) && (fVar1 <= (float)local_20)) {
        printf("%u: %0.4f\n",(double)fVar1,uVar4 & 0xffffffff);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_24);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
print_lambda(const char *fn, float32 min, float32 max)
{
    float32 *lmb;
    uint32 n_lmb;
    uint32 i;

    E_INFO("Reading %s\n",  fn);

    if (s3lamb_read(fn, &lmb, &n_lmb) != S3_SUCCESS)
	return S3_ERROR;

    for (i = 0; i < n_lmb; i++) {
	if ((lmb[i] >= min) && (lmb[i] <= max))
	    printf("%u: %0.4f\n", i, lmb[i]);
    }

    return S3_SUCCESS;
}